

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_internal_validate(roaring_bitmap_t *r,char **reason)

{
  ushort *puVar1;
  uint uVar2;
  uint uVar3;
  ushort *puVar4;
  _Bool _Var5;
  char *pcVar6;
  char **reason_00;
  ulong uVar7;
  ushort uVar8;
  long lVar9;
  char *reason_local;
  char *local_28;
  
  reason_00 = &local_28;
  if (reason != (char **)0x0) {
    reason_00 = reason;
  }
  *reason_00 = (char *)0x0;
  uVar2 = (r->high_low_container).size;
  if ((int)uVar2 < 0) {
    pcVar6 = "negative size";
  }
  else {
    uVar3 = (r->high_low_container).allocation_size;
    if ((int)uVar3 < 0) {
      pcVar6 = "negative allocation size";
    }
    else if (uVar3 < uVar2) {
      pcVar6 = "more containers than allocated space";
    }
    else if ((r->high_low_container).flags < 4) {
      if ((ulong)uVar2 == 0) {
        return true;
      }
      puVar4 = (r->high_low_container).keys;
      if (puVar4 == (ushort *)0x0) {
        pcVar6 = "keys is NULL";
      }
      else if ((r->high_low_container).typecodes == (uint8_t *)0x0) {
        pcVar6 = "typecodes is NULL";
      }
      else if ((r->high_low_container).containers == (void **)0x0) {
        pcVar6 = "containers is NULL";
      }
      else {
        if (uVar2 != 1) {
          uVar7 = 1;
          pcVar6 = "keys not strictly increasing";
          uVar8 = *puVar4;
          do {
            puVar1 = puVar4 + uVar7;
            if (*puVar1 <= uVar8) goto LAB_001036f6;
            uVar7 = uVar7 + 1;
            uVar8 = *puVar1;
          } while (uVar2 != uVar7);
        }
        lVar9 = 0;
        while (_Var5 = container_internal_validate
                                 ((r->high_low_container).containers[lVar9],
                                  (r->high_low_container).typecodes[lVar9],reason_00), _Var5) {
          lVar9 = lVar9 + 1;
          if ((r->high_low_container).size <= lVar9) {
            return true;
          }
        }
        if (*reason_00 != (char *)0x0) {
          return false;
        }
        pcVar6 = "container failed to validate but no reason given";
      }
    }
    else {
      pcVar6 = "invalid flags";
    }
  }
LAB_001036f6:
  *reason_00 = pcVar6;
  return false;
}

Assistant:

bool roaring_bitmap_internal_validate(const roaring_bitmap_t *r,
                                      const char **reason) {
    const char *reason_local;
    if (reason == NULL) {
        // Always allow assigning through *reason
        reason = &reason_local;
    }
    *reason = NULL;
    const roaring_array_t *ra = &r->high_low_container;
    if (ra->size < 0) {
        *reason = "negative size";
        return false;
    }
    if (ra->allocation_size < 0) {
        *reason = "negative allocation size";
        return false;
    }
    if (ra->size > ra->allocation_size) {
        *reason = "more containers than allocated space";
        return false;
    }
    if (ra->flags & ~(ROARING_FLAG_COW | ROARING_FLAG_FROZEN)) {
        *reason = "invalid flags";
        return false;
    }
    if (ra->size == 0) {
        return true;
    }

    if (ra->keys == NULL) {
        *reason = "keys is NULL";
        return false;
    }
    if (ra->typecodes == NULL) {
        *reason = "typecodes is NULL";
        return false;
    }
    if (ra->containers == NULL) {
        *reason = "containers is NULL";
        return false;
    }

    uint32_t prev_key = ra->keys[0];
    for (int32_t i = 1; i < ra->size; ++i) {
        if (ra->keys[i] <= prev_key) {
            *reason = "keys not strictly increasing";
            return false;
        }
        prev_key = ra->keys[i];
    }

    for (int32_t i = 0; i < ra->size; ++i) {
        if (!container_internal_validate(ra->containers[i], ra->typecodes[i],
                                         reason)) {
            // reason should already be set
            if (*reason == NULL) {
                *reason = "container failed to validate but no reason given";
            }
            return false;
        }
    }

    return true;
}